

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O2

void av1_set_size_dependent_vars(AV1_COMP *cpi,int *q,int *bottom_index,int *top_index)

{
  TplDepFrame *pTVar1;
  segmentation *seg;
  byte bVar2;
  byte bVar3;
  int iVar4;
  AV1_PRIMARY *pAVar5;
  AV1_PRIMARY *pAVar6;
  TplDepFrame *pTVar7;
  TplDepStats *pTVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  aom_rc_mode aVar13;
  int iVar14;
  int col;
  int mi_col;
  int row;
  int iVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double local_b8;
  double dStack_b0;
  double local_a8;
  
  av1_set_speed_features_framesize_dependent(cpi,cpi->speed);
  pAVar5 = cpi->ppi;
  if ((cpi->oxcf).algo_cfg.enable_tpl_model == true) {
    iVar11 = av1_tpl_stats_ready(&pAVar5->tpl_data,(uint)cpi->gf_frame_index);
    if (iVar11 != 0) {
      pAVar6 = cpi->ppi;
      bVar2 = cpi->gf_frame_index;
      pTVar7 = (pAVar6->tpl_data).tpl_frame;
      if (pTVar7[bVar2].is_valid != '\0') {
        pTVar1 = pTVar7 + bVar2;
        bVar3 = (pAVar6->tpl_data).tpl_stats_block_mis_log2;
        pTVar8 = pTVar7[bVar2].tpl_stats_ptr;
        iVar11 = pTVar1->stride;
        bVar2 = (cpi->common).superres_scale_denominator;
        iVar14 = (cpi->common).superres_upscaled_width;
        local_b8 = 0.0;
        dStack_b0 = 0.0;
        local_a8 = 1.0;
        for (iVar15 = 0; iVar15 < (cpi->common).mi_params.mi_rows;
            iVar15 = iVar15 + (1 << (bVar3 & 0x1f))) {
          for (mi_col = 0; mi_col < (int)(iVar14 + 7 >> 2 & 0xfffffffeU);
              mi_col = mi_col + (int)(((uint)bVar2 << (bVar3 & 0x1f)) + 4) / 8) {
            iVar12 = av1_tpl_ptr_pos(iVar15,mi_col,iVar11,
                                     (pAVar6->tpl_data).tpl_stats_block_mis_log2);
            dVar16 = (double)pTVar8[iVar12].srcrf_dist;
            iVar4 = pTVar1->base_rdmult;
            lVar9 = pTVar8[iVar12].mc_dep_rate;
            lVar10 = pTVar8[iVar12].mc_dep_dist;
            dVar17 = (double)(pTVar8[iVar12].recrf_dist << 7);
            dVar18 = log(dVar17);
            dVar17 = log((double)(lVar10 * 0x80 + (iVar4 * lVar9 + 0x100 >> 9)) + dVar17);
            local_a8 = local_a8 + dVar16;
            local_b8 = local_b8 + dVar16 * dVar18;
            dStack_b0 = dStack_b0 + dVar16 * dVar17;
          }
        }
        if ((dStack_b0 != 0.0) || (NAN(dStack_b0))) {
          dVar16 = exp((local_b8 - dStack_b0) / local_a8);
          (cpi->rd).r0 = dVar16;
          bVar2 = (pAVar6->gf_group).update_type[cpi->gf_frame_index];
          if ((bVar2 < 4) && (bVar2 != 1)) {
            pAVar6 = cpi->ppi;
            if (pAVar6->lap_enabled == 0) {
              dVar16 = ((pAVar6->tpl_data).r0_adjust_factor * 200.0) / dVar16;
              iVar11 = (pAVar6->p_rc).gfu_boost;
              iVar14 = (cpi->rc).frames_to_key;
              dVar18 = 4.0;
              dVar17 = dVar16;
            }
            else {
              dVar18 = (double)(pAVar6->p_rc).baseline_gf_interval;
              if (dVar18 < 0.0) {
                dVar18 = sqrt(dVar18);
              }
              else {
                dVar18 = SQRT(dVar18);
              }
              dVar17 = (cpi->rd).r0;
              dVar19 = (double)(cpi->ppi->p_rc).num_stats_required_for_gfu_boost;
              if (dVar19 < 0.0) {
                dVar19 = sqrt(dVar19);
              }
              else {
                dVar19 = SQRT(dVar19);
              }
              dVar16 = 10.0;
              if (10.0 <= dVar19) {
                dVar19 = 10.0;
              }
              if (dVar19 <= dVar18) {
                dVar19 = dVar18;
              }
              dVar17 = rint((dVar19 * 10.0 + 200.0) / dVar17);
              iVar11 = (cpi->ppi->p_rc).gfu_boost;
              iVar14 = (cpi->ppi->p_rc).num_stats_used_for_gfu_boost;
            }
            iVar11 = combine_prior_with_tpl_boost(dVar18,dVar16,iVar11,(int)dVar17,iVar14);
            (cpi->ppi->p_rc).gfu_boost = iVar11;
          }
        }
        else {
          pTVar1->is_valid = '\0';
        }
      }
      av1_tpl_rdmult_setup(cpi);
    }
  }
  iVar11 = av1_rc_pick_q_and_bounds
                     (cpi,(cpi->common).width,(cpi->common).height,(uint)cpi->gf_frame_index,
                      bottom_index,top_index);
  *q = iVar11;
  aVar13 = (cpi->oxcf).rc_cfg.mode;
  if (aVar13 == AOM_CBR) {
    if ((cpi->rc).force_max_q != 0) {
      *q = (cpi->rc).worst_quality;
      (cpi->rc).force_max_q = 0;
      aVar13 = (cpi->oxcf).rc_cfg.mode;
      goto LAB_008f9a33;
    }
  }
  else {
LAB_008f9a33:
    if (aVar13 == AOM_Q) {
      if (((cpi->ppi->tpl_data).tpl_frame[cpi->gf_frame_index].is_valid != '\0') &&
         (((cpi->oxcf).rc_cfg.best_allowed_q != 0 || ((cpi->oxcf).rc_cfg.worst_allowed_q != 0)))) {
        iVar15 = av1_tpl_get_q_index(&cpi->ppi->tpl_data,(uint)cpi->gf_frame_index,
                                     (cpi->rc).active_worst_quality,
                                     ((cpi->common).seq_params)->bit_depth);
        iVar11 = (cpi->oxcf).rc_cfg.worst_allowed_q;
        iVar14 = (cpi->oxcf).rc_cfg.best_allowed_q;
        if (iVar15 < iVar11) {
          iVar11 = iVar15;
        }
        if (iVar15 < iVar14) {
          iVar11 = iVar14;
        }
        *q = iVar11;
        *bottom_index = iVar11;
        *top_index = iVar11;
        if ((pAVar5->gf_group).update_type[cpi->gf_frame_index] == '\x03') {
          (cpi->ppi->p_rc).arf_q = *q;
        }
      }
    }
  }
  if (((cpi->oxcf).q_cfg.use_fixed_qp_offsets != 0) && ((cpi->oxcf).rc_cfg.mode == AOM_Q)) {
    bVar2 = (pAVar5->gf_group).update_type[cpi->gf_frame_index];
    if ((bVar2 < 4) && (bVar2 != 1)) {
      iVar11 = (cpi->rc).active_worst_quality;
      iVar11 = av1_get_q_index_from_qstep_ratio
                         (iVar11,((double)iVar11 / -255.0 + 1.0) *
                                 *(double *)
                                  (&DAT_00be3610 +
                                  (ulong)(0x14 < (cpi->ppi->p_rc).baseline_gf_interval) * 8) + 0.2,
                          ((cpi->common).seq_params)->bit_depth);
      *q = iVar11;
      *bottom_index = iVar11;
      *top_index = iVar11;
      bVar2 = (pAVar5->gf_group).update_type[cpi->gf_frame_index];
      if ((bVar2 < 4) && (bVar2 != 1)) {
        (cpi->ppi->p_rc).arf_q = *q;
      }
    }
    else {
      iVar11 = (pAVar5->gf_group).layer_depth[cpi->gf_frame_index];
      if (iVar11 < (pAVar5->gf_group).max_layer_depth) {
        iVar14 = (cpi->ppi->p_rc).arf_q;
        for (; 1 < iVar11; iVar11 = iVar11 + -1) {
          iVar14 = (iVar14 + (cpi->oxcf).rc_cfg.cq_level + 1) / 2;
        }
        *q = iVar14;
        *bottom_index = iVar14;
        *top_index = iVar14;
      }
    }
  }
  if ((AOM_RC_FIRST_PASS < (cpi->oxcf).pass) && ((cpi->sf).hl_sf.static_segmentation != 0)) {
    seg = &(cpi->common).seg;
    if ((cpi->common).current_frame.frame_type == '\0') {
      memset((cpi->enc_seg).map,0,
             (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
      (cpi->common).seg.update_map = '\0';
      (cpi->common).seg.update_data = '\0';
      av1_disable_segmentation(seg);
LAB_008f9d4b:
      av1_clearall_segfeatures(seg);
      return;
    }
    dVar16 = (cpi->ppi->p_rc).avg_q;
    if ((cpi->refresh_frame).alt_ref_frame == true) {
      memset((cpi->enc_seg).map,0,
             (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
      (cpi->common).seg.update_map = '\0';
      (cpi->common).seg.update_data = '\0';
      av1_disable_segmentation(seg);
      av1_clearall_segfeatures(seg);
      if ((cpi->common).seg.enabled != '\0') {
        (cpi->common).seg.update_map = '\x01';
        (cpi->common).seg.update_data = '\x01';
        iVar11 = av1_compute_qdelta(&cpi->rc,dVar16,dVar16 * 0.875,
                                    ((cpi->common).seq_params)->bit_depth);
        av1_set_segdata(seg,1,'\0',iVar11 + -2);
        av1_set_segdata(seg,1,'\x02',-2);
        av1_set_segdata(seg,1,'\x01',-2);
        av1_set_segdata(seg,1,'\x03',-2);
        av1_set_segdata(seg,1,'\x04',-2);
        av1_enable_segfeature(seg,1,'\x02');
        av1_enable_segfeature(seg,1,'\x01');
        av1_enable_segfeature(seg,1,'\x03');
        av1_enable_segfeature(seg,1,'\x04');
        av1_enable_segfeature(seg,1,'\0');
        return;
      }
    }
    else if (seg->enabled != '\0') {
      if ((cpi->rc).frames_since_golden == 0) {
        av1_disable_segmentation(seg);
        memset((cpi->enc_seg).map,0,
               (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
        (cpi->common).seg.update_map = '\0';
        (cpi->common).seg.update_data = '\0';
        goto LAB_008f9d4b;
      }
      if ((cpi->rc).is_src_frame_alt_ref == 0) {
        (cpi->common).seg.update_map = '\0';
        (cpi->common).seg.update_data = '\0';
      }
      else {
        av1_enable_segfeature(seg,0,'\x05');
        av1_enable_segfeature(seg,1,'\x05');
        av1_clear_segdata(seg,0,'\x05');
        av1_set_segdata(seg,0,'\x05',7);
        av1_clear_segdata(seg,1,'\x05');
        av1_set_segdata(seg,1,'\x05',7);
        if (48.0 < dVar16) {
          av1_enable_segfeature(seg,0,'\x06');
          av1_enable_segfeature(seg,1,'\x06');
        }
        (cpi->common).seg.update_data = '\x01';
      }
    }
  }
  return;
}

Assistant:

void av1_set_size_dependent_vars(AV1_COMP *cpi, int *q, int *bottom_index,
                                 int *top_index) {
  AV1_COMMON *const cm = &cpi->common;

  // Setup variables that depend on the dimensions of the frame.
  av1_set_speed_features_framesize_dependent(cpi, cpi->speed);

#if !CONFIG_REALTIME_ONLY
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  if (cpi->oxcf.algo_cfg.enable_tpl_model &&
      av1_tpl_stats_ready(&cpi->ppi->tpl_data, cpi->gf_frame_index)) {
    process_tpl_stats_frame(cpi);
    av1_tpl_rdmult_setup(cpi);
  }
#endif

  // Decide q and q bounds.
  *q = av1_rc_pick_q_and_bounds(cpi, cm->width, cm->height, cpi->gf_frame_index,
                                bottom_index, top_index);

  if (cpi->oxcf.rc_cfg.mode == AOM_CBR && cpi->rc.force_max_q) {
    *q = cpi->rc.worst_quality;
    cpi->rc.force_max_q = 0;
  }

#if !CONFIG_REALTIME_ONLY
  if (cpi->oxcf.rc_cfg.mode == AOM_Q &&
      cpi->ppi->tpl_data.tpl_frame[cpi->gf_frame_index].is_valid &&
      !is_lossless_requested(&cpi->oxcf.rc_cfg)) {
    const RateControlCfg *const rc_cfg = &cpi->oxcf.rc_cfg;
    const int tpl_q = av1_tpl_get_q_index(
        &cpi->ppi->tpl_data, cpi->gf_frame_index, cpi->rc.active_worst_quality,
        cm->seq_params->bit_depth);
    *q = clamp(tpl_q, rc_cfg->best_allowed_q, rc_cfg->worst_allowed_q);
    *top_index = *bottom_index = *q;
    if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE)
      cpi->ppi->p_rc.arf_q = *q;
  }

  if (cpi->oxcf.q_cfg.use_fixed_qp_offsets && cpi->oxcf.rc_cfg.mode == AOM_Q) {
    if (is_frame_tpl_eligible(gf_group, cpi->gf_frame_index)) {
      const double qratio_grad =
          cpi->ppi->p_rc.baseline_gf_interval > 20 ? 0.2 : 0.3;
      const double qstep_ratio =
          0.2 +
          (1.0 - (double)cpi->rc.active_worst_quality / MAXQ) * qratio_grad;
      *q = av1_get_q_index_from_qstep_ratio(
          cpi->rc.active_worst_quality, qstep_ratio, cm->seq_params->bit_depth);
      *top_index = *bottom_index = *q;
      if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
          gf_group->update_type[cpi->gf_frame_index] == KF_UPDATE ||
          gf_group->update_type[cpi->gf_frame_index] == GF_UPDATE)
        cpi->ppi->p_rc.arf_q = *q;
    } else if (gf_group->layer_depth[cpi->gf_frame_index] <
               gf_group->max_layer_depth) {
      int this_height = gf_group->layer_depth[cpi->gf_frame_index];
      int arf_q = cpi->ppi->p_rc.arf_q;
      while (this_height > 1) {
        arf_q = (arf_q + cpi->oxcf.rc_cfg.cq_level + 1) / 2;
        --this_height;
      }
      *top_index = *bottom_index = *q = arf_q;
    }
  }
#endif

  // Configure experimental use of segmentation for enhanced coding of
  // static regions if indicated.
  // Only allowed in the second pass of a two pass encode, as it requires
  // lagged coding, and if the relevant speed feature flag is set.
  if (is_stat_consumption_stage_twopass(cpi) &&
      cpi->sf.hl_sf.static_segmentation)
    configure_static_seg_features(cpi);
}